

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::UnknownField::SerializeLengthDelimitedNoTagToArray
          (UnknownField *this,uint8 *target)

{
  UnknownFieldSet *pUVar1;
  LogMessage *other;
  uint8 *puVar2;
  uint32 value;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (((undefined1  [16])*this & (undefined1  [16])0xe0000000) != (undefined1  [16])0x60000000) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x102);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type_): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  pUVar1 = (this->field_2).group_;
  value = (uint32)pUVar1[1].fields_;
  if (value < 0x80) {
    *target = (uint8)pUVar1[1].fields_;
    puVar2 = target + 1;
  }
  else {
    puVar2 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target);
  }
  puVar2 = io::CodedOutputStream::WriteRawToArray(pUVar1->fields_,*(int *)&pUVar1[1].fields_,puVar2)
  ;
  return puVar2;
}

Assistant:

uint8* UnknownField::SerializeLengthDelimitedNoTagToArray(uint8* target) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type_);
  const string& data = *length_delimited_.string_value_;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = io::CodedOutputStream::WriteStringToArray(data, target);
  return target;
}